

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-extra-close.c
# Opt level: O1

int main(void)

{
  int iVar1;
  undefined8 uVar2;
  uint uVar3;
  
  uVar2 = yajl_gen_alloc(0);
  iVar1 = yajl_gen_map_open(uVar2);
  uVar3 = 1;
  if (iVar1 == 0) {
    iVar1 = yajl_gen_map_close(uVar2);
    if (iVar1 == 0) {
      iVar1 = yajl_gen_map_close(uVar2);
      uVar3 = (uint)(iVar1 == 4);
    }
  }
  return uVar3;
}

Assistant:

int main(void) {
  yajl_gen yg;
  yajl_gen_status s;

  yg = yajl_gen_alloc(NULL);
  CHK(yajl_gen_map_open(yg));
  CHK(yajl_gen_map_close(yg));
  s = yajl_gen_map_close(yg);

  return (yajl_gen_generation_complete == s);
}